

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketAcceptor.cpp
# Opt level: O0

void __thiscall FIX::SocketAcceptor::onStart(SocketAcceptor *this)

{
  SocketServer *this_00;
  bool bVar1;
  time_t tVar2;
  int __fd;
  Strategy *in_RSI;
  bool local_29;
  time_t local_20;
  time_t now;
  time_t start;
  SocketAcceptor *this_local;
  
  start = (time_t)this;
  do {
    bVar1 = Acceptor::isStopped(&this->super_Acceptor);
    local_29 = false;
    if ((!bVar1) && (local_29 = false, this->m_pServer != (SocketServer *)0x0)) {
      in_RSI = &this->super_Strategy;
      local_29 = SocketServer::block(this->m_pServer,in_RSI,false,0.0);
    }
  } while (local_29 != false);
  if (this->m_pServer != (SocketServer *)0x0) {
    now = 0;
    local_20 = 0;
    time(&now);
    do {
      __fd = (int)in_RSI;
      bVar1 = Acceptor::isLoggedOn(&this->super_Acceptor);
      if (!bVar1) break;
      in_RSI = &this->super_Strategy;
      SocketServer::block(this->m_pServer,in_RSI,false,0.0);
      tVar2 = time(&local_20);
      __fd = (int)in_RSI;
    } while (tVar2 + -5 < now);
    SocketServer::close(this->m_pServer,__fd);
    this_00 = this->m_pServer;
    if (this_00 != (SocketServer *)0x0) {
      SocketServer::~SocketServer(this_00);
      operator_delete(this_00,0x160);
    }
    this->m_pServer = (SocketServer *)0x0;
  }
  return;
}

Assistant:

void SocketAcceptor::onStart() {
  while (!isStopped() && m_pServer && m_pServer->block(*this)) {}

  if (!m_pServer) {
    return;
  }

  time_t start = 0;
  time_t now = 0;

  ::time(&start);
  while (isLoggedOn()) {
    m_pServer->block(*this);
    if (::time(&now) - 5 >= start) {
      break;
    }
  }

  m_pServer->close();
  delete m_pServer;
  m_pServer = 0;
}